

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

double benchmark_insert<eumorphic::collection<stack_container,A,B,C,D,CA,CB>>(size_t num_elems)

{
  size_t sVar1;
  double dVar2;
  undefined1 auVar3 [16];
  double duration;
  double t;
  ulong local_d340;
  size_t i;
  time_point start;
  collection<stack_container,_A,_B,_C,_D,_CA,_CB> container;
  size_t num_elems_local;
  
  eumorphic::collection<stack_container,_A,_B,_C,_D,_CA,_CB>::collection
            ((collection<stack_container,_A,_B,_C,_D,_CA,_CB> *)&start);
  i = (size_t)tic();
  for (local_d340 = 0; local_d340 != num_elems / 5; local_d340 = local_d340 + 1) {
    insert_default_value_of<CA,eumorphic::collection<stack_container,A,B,C,D,CA,CB>>
              ((collection<stack_container,_A,_B,_C,_D,_CA,_CB> *)&start);
    insert_default_value_of<B,eumorphic::collection<stack_container,A,B,C,D,CA,CB>>
              ((collection<stack_container,_A,_B,_C,_D,_CA,_CB> *)&start);
    insert_default_value_of<A,eumorphic::collection<stack_container,A,B,C,D,CA,CB>>
              ((collection<stack_container,_A,_B,_C,_D,_CA,_CB> *)&start);
    insert_default_value_of<C,eumorphic::collection<stack_container,A,B,C,D,CA,CB>>
              ((collection<stack_container,_A,_B,_C,_D,_CA,_CB> *)&start);
    insert_default_value_of<D,eumorphic::collection<stack_container,A,B,C,D,CA,CB>>
              ((collection<stack_container,_A,_B,_C,_D,_CA,_CB> *)&start);
  }
  dVar2 = toc((time_point *)&i);
  sVar1 = eumorphic::collection<stack_container,_A,_B,_C,_D,_CA,_CB>::size
                    ((collection<stack_container,_A,_B,_C,_D,_CA,_CB> *)&start);
  auVar3._8_4_ = (int)(sVar1 >> 0x20);
  auVar3._0_8_ = sVar1;
  auVar3._12_4_ = 0x45300000;
  do_not_optimize_out<stack_container,_A,_B,_C,_D,_CA,_CB>
            ((collection<stack_container,_A,_B,_C,_D,_CA,_CB> *)&start);
  eumorphic::collection<stack_container,_A,_B,_C,_D,_CA,_CB>::~collection
            ((collection<stack_container,_A,_B,_C,_D,_CA,_CB> *)&start);
  return dVar2 / ((auVar3._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0));
}

Assistant:

double benchmark_insert( std::size_t num_elems)
{
	Cont container;

	//std::cout << "i";
	
	auto start = tic();
	{
                        for (size_t i = 0; i != num_elems/5; i++)
			{
				insert_default_value_of<CA>(container);
				insert_default_value_of<B>(container);
				insert_default_value_of<A>(container);
				insert_default_value_of<C>(container);
				insert_default_value_of<D>(container);
			}
	}
	double t = toc(start);
	double duration = t / container.size();
	do_not_optimize_out(container);

	return duration;
}